

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextSpecsOf.hpp
# Opt level: O2

string * __thiscall
sciplot::TextSpecsOf<sciplot::TicsSpecs>::repr_abi_cxx11_
          (string *__return_storage_ptr__,TextSpecsOf<sciplot::TicsSpecs> *this)

{
  ostream *poVar1;
  stringstream ss;
  string local_1e0;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,(string *)&this->m_enhanced);
  poVar1 = std::operator<<(poVar1," textcolor ");
  poVar1 = std::operator<<(poVar1,(string *)&this->m_color);
  std::operator<<(poVar1," ");
  FontSpecsOf<sciplot::TicsSpecs>::repr_abi_cxx11_
            (&local_1c0,&this->super_FontSpecsOf<sciplot::TicsSpecs>);
  std::operator<<(local_190,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  internal::removeExtraWhitespaces(__return_storage_ptr__,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

auto TextSpecsOf<DerivedSpecs>::repr() const -> std::string
{
    std::stringstream ss;
    ss << m_enhanced << " textcolor " << m_color << " ";
    ss << FontSpecsOf<DerivedSpecs>::repr();
    return internal::removeExtraWhitespaces(ss.str());
}